

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

int __thiscall
opengv::relative_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  RelativeAdapterBase *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  PointerType ptr;
  Indices *pIVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar41 [16];
  double dVar43;
  double dVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  bearingVector_t f1;
  translation_t cam2Offset;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  bearingVector_t f2;
  translation_t cam1Offset;
  rotation_t directRotation;
  rotation_t cam1Rotation;
  rotation_t rotation;
  rotation_t cam2Rotation;
  cayley_t cayley;
  undefined1 local_300 [16];
  double local_2f0;
  double dStack_2e8;
  double local_2e0;
  double dStack_2d8;
  point_t local_2d0;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_290;
  double local_288;
  double local_280;
  double dStack_278;
  double local_270;
  undefined8 local_268;
  undefined1 local_260 [16];
  double local_250;
  double dStack_248;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  double local_220;
  double dStack_218;
  double local_210;
  double dStack_208;
  double local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  double local_1e0;
  double dStack_1d8;
  undefined8 local_1d0;
  undefined1 local_1c0 [16];
  double local_1b0 [2];
  undefined1 local_1a0 [16];
  double local_190;
  double dStack_188;
  undefined1 local_180 [16];
  double local_170;
  double dStack_168;
  double local_160;
  double local_150;
  double dStack_148;
  undefined8 uStack_140;
  double local_138;
  double dStack_130;
  undefined8 local_128;
  double local_120;
  double dStack_118;
  double local_110;
  undefined1 local_100 [16];
  double local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_d0 [16];
  double local_c0 [10];
  cayley_t local_70 [2];
  
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_250 = *pdVar1;
  dStack_248 = pdVar1[1];
  local_290 = pdVar1[2];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = pdVar1[3];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = pdVar1[4];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = pdVar1[5];
  math::cayley2rot(local_70);
  local_268 = 0x3ff0000000000000;
  pIVar21 = this->_indices;
  if (pIVar21->_numberCorrespondences != 0) {
    local_260._8_8_ = 0x3ff0000000000000;
    local_260._0_8_ = 0x3ff0000000000000;
    uVar24 = 0;
    do {
      iVar23 = (int)uVar24;
      iVar20 = iVar23;
      if (pIVar21->_useIndices == true) {
        iVar20 = (pIVar21->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[5])(local_1c0,this->_adapter,(long)iVar20);
      iVar20 = iVar23;
      if (this->_indices->_useIndices == true) {
        iVar20 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[6])(&local_150,this->_adapter,(long)iVar20);
      iVar20 = iVar23;
      if (this->_indices->_useIndices == true) {
        iVar20 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[7])(&local_2b0,this->_adapter,(long)iVar20);
      iVar20 = iVar23;
      if (this->_indices->_useIndices == true) {
        iVar20 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[8])(local_c0 + 1,this->_adapter,(long)iVar20);
      auVar51._8_8_ = local_2a0;
      auVar51._0_8_ = local_2a0;
      auVar8._8_8_ = dStack_248;
      auVar8._0_8_ = local_250;
      auVar54._8_8_ = local_d8;
      auVar54._0_8_ = local_d8;
      lVar22 = 0x10;
      auVar27._8_8_ = local_2b0;
      auVar27._0_8_ = local_2b0;
      auVar25 = vmulpd_avx512vl(local_100,auVar27);
      auVar27 = vsubpd_avx(auVar8,local_1c0);
      auVar26._8_8_ = local_2a8;
      auVar26._0_8_ = local_2a8;
      auVar26 = vfmadd231pd_avx512vl(auVar25,local_e8,auVar26);
      dVar4 = local_e8._0_8_;
      dVar6 = local_e8._8_8_;
      auVar26 = vfmadd231pd_fma(auVar26,local_d0,auVar51);
      dVar28 = auVar27._0_8_ + auVar26._0_8_;
      dVar32 = auVar27._8_8_ + auVar26._8_8_;
      auVar40._8_8_ = local_f0;
      auVar40._0_8_ = local_f0;
      auVar25._8_8_ = local_138;
      auVar25._0_8_ = uStack_140;
      auVar27 = vmovhpd_avx(auVar25,local_128);
      dVar3 = (local_290 - local_1b0[0]) +
              local_f0 * local_2b0 + local_d8 * local_2a8 + local_c0[0] * local_2a0;
      dVar5 = auVar27._0_8_;
      dVar7 = auVar27._8_8_;
      dVar55 = dVar28 * local_150 + dVar32 * dStack_148 + dVar3 * dVar5;
      local_288 = local_138 * dVar28 + dStack_130 * dVar32 + dVar3 * dVar7;
      dVar43 = local_100._0_8_;
      dVar46 = local_100._8_8_;
      dVar3 = local_110 * dVar3 + local_120 * dVar28 + dStack_118 * dVar32;
      dVar28 = local_120 * dVar43;
      dVar32 = dStack_118 * dVar46;
      auVar27 = vunpcklpd_avx(auVar40,auVar54);
      dVar39 = local_110 * auVar27._0_8_;
      dVar42 = local_110 * auVar27._8_8_;
      auVar33._0_8_ = local_f0 * dVar5 + dVar43 * local_150 + dVar46 * dStack_148;
      auVar33._8_8_ = local_f0 * dVar7 + local_138 * dVar43 + dStack_130 * dVar46;
      dVar43 = local_120 * dVar4;
      dVar46 = dStack_118 * dVar6;
      dVar47 = local_d0._0_8_;
      dVar49 = local_d0._8_8_;
      dVar48 = local_120 * dVar47;
      dVar50 = dStack_118 * dVar49;
      auVar36._0_8_ = local_d8 * dVar5 + dVar4 * local_150 + dVar6 * dStack_148;
      auVar36._8_8_ = local_d8 * dVar7 + local_138 * dVar4 + dStack_130 * dVar6;
      dVar4 = local_c0[0] * local_110;
      auVar44._0_8_ = local_c0[0] * dVar5 + dVar47 * local_150 + dVar49 * dStack_148;
      auVar44._8_8_ = local_c0[0] * dVar7 + local_138 * dVar47 + dStack_130 * dVar49;
      do {
        auVar9._8_8_ = *(undefined8 *)(local_d0 + lVar22 + 8);
        auVar9._0_8_ = *(undefined8 *)(local_d0 + lVar22 + 8);
        auVar27 = vmulpd_avx512vl(auVar33,auVar9);
        dVar5 = *(double *)((long)local_c0 + lVar22 + 8U);
        auVar52._8_8_ = dVar5;
        auVar52._0_8_ = dVar5;
        auVar10._8_8_ = *(undefined8 *)((long)local_c0 + lVar22);
        auVar10._0_8_ = *(undefined8 *)((long)local_c0 + lVar22);
        auVar27 = vfmadd231pd_avx512vl(auVar27,auVar36,auVar10);
        auVar27 = vfmadd231pd_fma(auVar27,auVar44,auVar52);
        *(undefined1 (*) [16])((long)local_1b0 + lVar22) = auVar27;
        auVar53._0_8_ = (dVar39 + dVar28 + dVar32) * *(double *)(local_d0 + lVar22 + 8);
        auVar53._8_8_ = (dVar42 + dVar43 + dVar46) * *(double *)((long)local_c0 + lVar22);
        auVar27 = vshufpd_avx(auVar53,auVar53,1);
        *(double *)(local_1a0 + lVar22) =
             auVar53._0_8_ + auVar27._0_8_ + (dVar4 + dVar48 + dVar50) * dVar5;
        dVar7 = local_160;
        dVar5 = dStack_168;
        dVar6 = local_170;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x58);
      pRVar2 = this->_adapter;
      (pRVar2->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = dVar55;
      (pRVar2->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_288;
      (pRVar2->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = dVar3;
      pRVar2 = this->_adapter;
      *(undefined1 (*) [16])
       (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array = local_1a0;
      (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = local_190;
      (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = dStack_188;
      *(undefined1 (*) [16])
       ((pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array + 4) = local_180;
      (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = local_170;
      (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = dStack_168;
      (pRVar2->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = local_160;
      local_300._8_8_ = 0;
      local_300._0_8_ = local_160;
      local_220 = local_1a0._0_8_;
      auVar27 = vshufpd_avx(local_1a0,local_180,1);
      dStack_218 = dStack_188;
      auVar45._0_8_ = dVar55 * local_220;
      auVar45._8_8_ = dVar55 * dStack_188;
      auVar11._8_8_ = local_288;
      auVar11._0_8_ = local_288;
      auVar26 = vfnmsub231pd_avx512vl(auVar45,auVar27,auVar11);
      local_288 = dStack_168 * local_288;
      local_1f0._8_8_ = dVar3;
      local_1f0._0_8_ = dVar3;
      iVar20 = iVar23;
      if (this->_indices->_useIndices == true) {
        iVar20 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      local_230._8_8_ = local_180._8_8_;
      local_230._0_8_ = local_190;
      local_240 = vfnmadd231pd_fma(auVar26,local_230,local_1f0);
      triangulation::triangulate2(&local_2d0,this->_adapter,(long)iVar20);
      local_210 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      dStack_208 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
      local_280 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      dStack_278 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
      local_270 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
      local_200 = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
      uStack_1f8 = 0;
      auVar17._8_8_ = dStack_218;
      auVar17._0_8_ = local_220;
      auVar12._8_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar12._0_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar26 = vmulpd_avx512vl(auVar17,auVar12);
      auVar13._8_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar13._0_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar27 = vfmadd231pd_avx512vl(auVar26,auVar27,auVar13);
      auVar14._8_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar14._0_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar27 = vfmadd231pd_avx512vl(auVar27,local_230,auVar14);
      auVar15._8_8_ = local_268;
      auVar15._0_8_ = local_268;
      auVar27 = vfmadd231pd_avx512vl(auVar27,local_240,auVar15);
      dVar5 = dVar5 * local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1];
      iVar20 = iVar23;
      if (this->_indices->_useIndices == true) {
        iVar20 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[2])(&local_2d0,this->_adapter,(long)iVar20);
      if (this->_indices->_useIndices == true) {
        iVar23 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar23];
      }
      auVar18._8_8_ = dStack_208;
      auVar18._0_8_ = local_210;
      auVar19._8_8_ = uStack_1f8;
      auVar19._0_8_ = local_200;
      auVar16._8_8_ = 0x8000000000000000;
      auVar16._0_8_ = 0x8000000000000000;
      auVar26 = vxorpd_avx512vl(local_300,auVar16);
      dVar3 = dVar6 * local_210 + dVar5 +
              dVar7 * local_200 +
              ((auVar26._0_8_ * (double)local_1f0._0_8_ - local_288) - dVar6 * dVar55);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_200 * local_200 + local_210 * local_210 + dStack_208 * dStack_208;
      auVar8 = vsqrtpd_avx(auVar34);
      auVar37._8_8_ = auVar8._0_8_;
      auVar37._0_8_ = auVar8._0_8_;
      auVar26 = vdivpd_avx(auVar18,auVar37);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar3;
      auVar33 = vunpcklpd_avx(auVar19,auVar29);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = auVar27._0_8_ * auVar27._0_8_ + auVar27._8_8_ * auVar27._8_8_ + dVar3 * dVar3;
      auVar25 = vsqrtpd_avx(auVar38);
      auVar41._8_8_ = auVar25._0_8_;
      auVar41._0_8_ = auVar25._0_8_;
      auVar8 = vunpcklpd_avx(auVar8,auVar25);
      auVar8 = vdivpd_avx(auVar33,auVar8);
      auVar27 = vdivpd_avx(auVar27,auVar41);
      (*this->_adapter->_vptr_RelativeAdapterBase[3])(&local_1e0,this->_adapter,(long)iVar23);
      local_2e0 = auVar26._0_8_;
      dStack_2d8 = auVar26._8_8_;
      local_300._0_8_ = auVar27._0_8_;
      local_300._8_8_ = auVar27._8_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar27 = vmovhpd_avx(auVar35,local_1d0);
      local_2f0 = auVar8._0_8_;
      dStack_2e8 = auVar8._8_8_;
      auVar30._0_8_ =
           local_2e0 *
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] +
           dStack_2d8 *
           local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] + auVar27._0_8_ * local_2f0;
      auVar30._8_8_ =
           (double)local_300._0_8_ * local_1e0 + (double)local_300._8_8_ * dStack_1d8 +
           auVar27._8_8_ * dStack_2e8;
      auVar27 = vsubpd_avx(local_260,auVar30);
      auVar31._0_8_ = auVar27._0_8_ + auVar27._8_8_;
      auVar31._8_8_ = auVar27._0_8_ + auVar27._8_8_;
      dVar3 = (double)vmovlpd_avx(auVar31);
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar24] = dVar3;
      uVar24 = uVar24 + 1;
      pIVar21 = this->_indices;
    } while (uVar24 < pIVar21->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      translation_t cam1Offset = _adapter.getCamOffset1(_indices[i]);
      rotation_t cam1Rotation = _adapter.getCamRotation1(_indices[i]);
      translation_t cam2Offset = _adapter.getCamOffset2(_indices[i]);
      rotation_t cam2Rotation = _adapter.getCamRotation2(_indices[i]);

      translation_t directTranslation =
          cam1Rotation.transpose() *
          ((translation - cam1Offset) + rotation * cam2Offset);
      rotation_t directRotation =
          cam1Rotation.transpose() * rotation * cam2Rotation;

      _adapter.sett12(directTranslation);
      _adapter.setR12(directRotation);

      transformation_t inverseSolution;
      inverseSolution.block<3,3>(0,0) = directRotation.transpose();
      inverseSolution.col(3) =
          -inverseSolution.block<3,3>(0,0)*directTranslation;

      p_hom.block<3,1>(0,0) =
          opengv::triangulation::triangulate2(_adapter,_indices[i]);
      bearingVector_t reprojection1 = p_hom.block<3,1>(0,0);
      bearingVector_t reprojection2 = inverseSolution * p_hom;
      reprojection1 = reprojection1 / reprojection1.norm();
      reprojection2 = reprojection2 / reprojection2.norm();
      bearingVector_t f1 = _adapter.getBearingVector1(_indices[i]);
      bearingVector_t f2 = _adapter.getBearingVector2(_indices[i]);

      //bearing-vector based outlier criterium (select threshold accordingly):
      //1-(f1'*f2) = 1-cos(alpha) \in [0:2]
      double reprojError1 = 1.0 - (f1.transpose() * reprojection1);
      double reprojError2 = 1.0 - (f2.transpose() * reprojection2);
      double factor = 1.0;
      fvec[i] = factor*(reprojError1 + reprojError2);
    }

    return 0;
  }